

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Type * google::protobuf::internal::
       GenericTypeHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::New(Arena *arena,Type *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Type *value_local;
  Arena *arena_local;
  
  pbVar1 = Arena::Create<std::__cxx11::string,std::__cxx11::string>(arena,value);
  return pbVar1;
}

Assistant:

static PROTOBUF_NOINLINE Type* New(Arena* arena, Type&& value) {
    return Arena::Create<Type>(arena, std::move(value));
  }